

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

uint32_t mpack_expect_map_range(mpack_reader_t *reader,uint32_t min_value,uint32_t max_value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = mpack_expect_map(reader);
  uVar2 = min_value;
  if ((reader->error == mpack_ok) && (uVar2 = uVar1, uVar1 < min_value || max_value < uVar1)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    uVar2 = min_value;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  return uVar2;
}

Assistant:

uint32_t mpack_expect_map_range(mpack_reader_t* reader, uint32_t min_value, uint32_t max_value) {MPACK_EXPECT_RANGE_IMPL(map, uint32_t)}